

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int get_path_component(char *name,int n,char *fn)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined4 in_register_00000034;
  char *__s;
  int iVar4;
  
  __s = (char *)CONCAT44(in_register_00000034,n);
  pcVar2 = strchr(__s,0x2f);
  if (pcVar2 == (char *)0x0) {
    sVar3 = strlen(__s);
    iVar4 = (int)sVar3;
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    iVar4 = (int)pcVar2 - n;
  }
  iVar1 = -1;
  if (iVar4 < 0x100) {
    memcpy(name,__s,(long)iVar4);
    name[iVar4] = '\0';
    iVar1 = iVar4;
  }
  return iVar1;
}

Assistant:

static int
get_path_component(char *name, int n, const char *fn)
{
	char *p;
	int l;

	p = strchr(fn, '/');
	if (p == NULL) {
		if ((l = (int)strlen(fn)) == 0)
			return (0);
	} else
		l = (int)(p - fn);
	if (l > n -1)
		return (-1);
	memcpy(name, fn, l);
	name[l] = '\0';

	return (l);
}